

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_uniformuiv(NegativeTestContext *ctx)

{
  undefined *puVar1;
  deUint64 dVar2;
  deUint32 dVar3;
  GLint location;
  RenderContext *renderCtx;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  GLuint local_270;
  GLuint local_26c;
  GLuint programEmpty;
  GLuint shader;
  GLuint params [4];
  allocator<char> local_249;
  GLint unif;
  string local_228;
  allocator<char> local_1f1;
  string local_1f0;
  string local_1d0;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  NegativeTestContext *ctx_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)ctx;
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = uniformTestVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,puVar1,&local_1f1);
  getVtxFragVersionSources
            (&local_1d0,&local_1f0,(NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  puVar1 = uniformTestFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&unif,puVar1,&local_249);
  getVtxFragVersionSources
            (&local_228,(string *)&unif,(NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  glu::makeVtxFragSources(&local_1b0,&local_1d0,&local_228);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&unif);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  location = glu::CallLogWrapper::glGetUniformLocation((CallLogWrapper *)dVar2,dVar3,"fUnif_uvec4");
  dVar2 = program.m_program.m_info.linkTimeUs;
  _programEmpty = 0;
  params[0] = 0;
  params[1] = 0;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar2,dVar3);
  dVar2 = program.m_program.m_info.linkTimeUs;
  if (location == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"Failed to retrieve uniform location",&local_291);
    NegativeTestContext::fail((NegativeTestContext *)dVar2,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
  }
  local_26c = glu::CallLogWrapper::glCreateShader
                        ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,0x8b31);
  local_270 = glu::CallLogWrapper::glCreateProgram
                        ((CallLogWrapper *)program.m_program.m_info.linkTimeUs);
  dVar2 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             &local_2b9);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  glu::CallLogWrapper::glGetUniformuiv
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,0xffffffff,location,&programEmpty
            );
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x501)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  dVar2 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,
             "GL_INVALID_OPERATION is generated if program is not a program object.",&local_2e1);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  glu::CallLogWrapper::glGetUniformuiv
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,local_26c,location,&programEmpty)
  ;
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  dVar2 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,
             "GL_INVALID_OPERATION is generated if program has not been successfully linked.",
             &local_309);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  glu::CallLogWrapper::glGetUniformuiv
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,local_270,location,&programEmpty)
  ;
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  dVar2 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,
             "GL_INVALID_OPERATION is generated if location does not correspond to a valid uniform variable location for the specified program object."
             ,&local_331);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glGetUniformuiv((CallLogWrapper *)dVar2,dVar3,-1,&programEmpty);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  glu::CallLogWrapper::glDeleteShader
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,local_26c);
  glu::CallLogWrapper::glDeleteProgram
            ((CallLogWrapper *)program.m_program.m_info.linkTimeUs,local_270);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return;
}

Assistant:

void get_uniformuiv (NegativeTestContext& ctx)
{
	glu::ShaderProgram	program			(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLint				unif			= ctx.glGetUniformLocation(program.getProgram(), "fUnif_uvec4");
	GLuint				params[4]		= { 0, 0, 0, 0 };
	GLuint				shader;
	GLuint				programEmpty;

	ctx.glUseProgram(program.getProgram());

	if (unif == -1)
		ctx.fail("Failed to retrieve uniform location");

	shader = ctx.glCreateShader(GL_VERTEX_SHADER);
	programEmpty = ctx.glCreateProgram();

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glGetUniformuiv (-1, unif, &params[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetUniformuiv (shader, unif, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program has not been successfully linked.");
	ctx.glGetUniformuiv (programEmpty, unif, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if location does not correspond to a valid uniform variable location for the specified program object.");
	ctx.glGetUniformuiv (program.getProgram(), -1, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteShader(shader);
	ctx.glDeleteProgram(programEmpty);
}